

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
~BlockingQueue(BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> pushLock;
  lock_guard<std::mutex> pullLock;
  mutex_type *in_stack_ffffffffffffffd8;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x4c18c2);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x4c18d0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4c18da);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4c18e4);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0x11));
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
            (in_stack_fffffffffffffff0);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
            (in_stack_fffffffffffffff0);
  return;
}

Assistant:

~BlockingQueue()
        {
            // these locks are primarily for memory synchronization multiple
            // access in the destructor would be a bad thing
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            pushElements.clear();
            pullElements.clear();
        }